

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O2

int __thiscall QAbstractScrollAreaPrivate::init(QAbstractScrollAreaPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *parent;
  QScrollBar *pQVar1;
  QAbstractScrollAreaScrollBarContainer *pQVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  QAbstractScrollAreaFilter *this_00;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  Connection CStack_58;
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  aVar3.m_data = operator_new(0x28);
  QWidget::QWidget((QWidget *)aVar3.m_data,parent,(WindowFlags)0x0);
  this->viewport = (QWidget *)aVar3;
  QVar4.m_size = (size_t)"qt_scrollarea_viewport";
  QVar4.field_0.m_data = aVar3.m_data;
  QObject::setObjectName(QVar4);
  QWidget::setBackgroundRole(this->viewport,Base);
  QWidget::setAutoFillBackground(this->viewport,true);
  aVar3.m_data = operator_new(0x40);
  QAbstractScrollAreaScrollBarContainer::QAbstractScrollAreaScrollBarContainer
            ((QAbstractScrollAreaScrollBarContainer *)aVar3.m_data,Horizontal,parent);
  (this->scrollBarContainers).m_data[0] = (QAbstractScrollAreaScrollBarContainer *)aVar3;
  QVar5.m_size = (size_t)"qt_scrollarea_hcontainer";
  QVar5.field_0.m_data = aVar3.m_data;
  QObject::setObjectName(QVar5);
  pQVar1 = (this->scrollBarContainers).m_data[0]->scrollBar;
  this->hbar = pQVar1;
  QAbstractSlider::setRange(&pQVar1->super_QAbstractSlider,0,0);
  pQVar2 = (this->scrollBarContainers).m_data[0];
  (**(code **)(*(long *)&pQVar2->super_QWidget + 0x68))(pQVar2,0);
  QObject::installEventFilter((QObject *)this->hbar);
  QObject::connect(local_40,(char *)this->hbar,(QObject *)"2valueChanged(int)",(char *)parent,
                   0x5f7737);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QObject::connect(local_48,(char *)this->hbar,(QObject *)"2rangeChanged(int,int)",(char *)parent,
                   0x5f776e);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  aVar3.m_data = operator_new(0x40);
  QAbstractScrollAreaScrollBarContainer::QAbstractScrollAreaScrollBarContainer
            ((QAbstractScrollAreaScrollBarContainer *)aVar3.m_data,Vertical,parent);
  ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)((this->scrollBarContainers).m_data + 1))->m_data
       = (void *)aVar3;
  QVar6.m_size = (size_t)"qt_scrollarea_vcontainer";
  QVar6.field_0.m_data = aVar3.m_data;
  QObject::setObjectName(QVar6);
  pQVar1 = (this->scrollBarContainers).m_data[1]->scrollBar;
  this->vbar = pQVar1;
  QAbstractSlider::setRange(&pQVar1->super_QAbstractSlider,0,0);
  pQVar2 = (this->scrollBarContainers).m_data[1];
  (**(code **)(*(long *)&pQVar2->super_QWidget + 0x68))(pQVar2,0);
  QObject::installEventFilter((QObject *)this->vbar);
  QObject::connect(local_50,(char *)this->vbar,(QObject *)"2valueChanged(int)",(char *)parent,
                   0x5f7747);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QObject::connect((QObject *)&CStack_58,(char *)this->vbar,(QObject *)"2rangeChanged(int,int)",
                   (char *)parent,0x5f776e);
  QMetaObject::Connection::~Connection(&CStack_58);
  this_00 = (QAbstractScrollAreaFilter *)operator_new(0x18);
  QAbstractScrollAreaFilter::QAbstractScrollAreaFilter(this_00,this);
  QScopedPointer<QObject,_QScopedPointerDeleter<QObject>_>::reset
            (&this->viewportFilter,(QObject *)this_00);
  QObject::installEventFilter(&this->viewport->super_QObject);
  QWidget::setFocusProxy(this->viewport,parent);
  QWidget::setFocusPolicy(parent,StrongFocus);
  QFrame::setFrameStyle((QFrame *)parent,0x36);
  QWidget::setSizePolicy(parent,(QSizePolicy)0x770000);
  layoutChildren(this);
  QWidget::grabGesture(this->viewport,PanGesture,(GestureFlags)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractScrollAreaPrivate::init()
{
    Q_Q(QAbstractScrollArea);
    viewport = new QWidget(q);
    viewport->setObjectName("qt_scrollarea_viewport"_L1);
    viewport->setBackgroundRole(QPalette::Base);
    viewport->setAutoFillBackground(true);
    scrollBarContainers[Qt::Horizontal] = new QAbstractScrollAreaScrollBarContainer(Qt::Horizontal, q);
    scrollBarContainers[Qt::Horizontal]->setObjectName("qt_scrollarea_hcontainer"_L1);
    hbar = scrollBarContainers[Qt::Horizontal]->scrollBar;
    hbar->setRange(0,0);
    scrollBarContainers[Qt::Horizontal]->setVisible(false);
    hbar->installEventFilter(q);
    QObject::connect(hbar, SIGNAL(valueChanged(int)), q, SLOT(_q_hslide(int)));
    QObject::connect(hbar, SIGNAL(rangeChanged(int,int)), q, SLOT(_q_showOrHideScrollBars()), Qt::QueuedConnection);
    scrollBarContainers[Qt::Vertical] = new QAbstractScrollAreaScrollBarContainer(Qt::Vertical, q);
    scrollBarContainers[Qt::Vertical]->setObjectName("qt_scrollarea_vcontainer"_L1);
    vbar = scrollBarContainers[Qt::Vertical]->scrollBar;
    vbar->setRange(0,0);
    scrollBarContainers[Qt::Vertical]->setVisible(false);
    vbar->installEventFilter(q);
    QObject::connect(vbar, SIGNAL(valueChanged(int)), q, SLOT(_q_vslide(int)));
    QObject::connect(vbar, SIGNAL(rangeChanged(int,int)), q, SLOT(_q_showOrHideScrollBars()), Qt::QueuedConnection);
    viewportFilter.reset(new QAbstractScrollAreaFilter(this));
    viewport->installEventFilter(viewportFilter.data());
    viewport->setFocusProxy(q);
    q->setFocusPolicy(Qt::StrongFocus);
    q->setFrameStyle(QFrame::StyledPanel | QFrame::Sunken);
    q->setSizePolicy(QSizePolicy::Expanding, QSizePolicy::Expanding);
    layoutChildren();
#ifndef Q_OS_MACOS
#  ifndef QT_NO_GESTURES
    viewport->grabGesture(Qt::PanGesture);
#  endif
#endif
}